

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O2

QList<QtGraphicsAnchorLayout::AnchorData_*> * __thiscall
QSet<QtGraphicsAnchorLayout::AnchorData_*>::values
          (QList<QtGraphicsAnchorLayout::AnchorData_*> *__return_storage_ptr__,
          QSet<QtGraphicsAnchorLayout::AnchorData_*> *this)

{
  Data *pDVar1;
  Span *pSVar2;
  ulong uVar3;
  size_t asize;
  long in_FS_OFFSET;
  piter local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (AnchorData **)0x0;
  pDVar1 = (this->q_hash).d;
  if (pDVar1 == (Data *)0x0) {
    asize = 0;
  }
  else {
    asize = pDVar1->size;
  }
  QList<QtGraphicsAnchorLayout::AnchorData_*>::reserve(__return_storage_ptr__,asize);
  local_28 = (piter)QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>::constBegin
                              (&this->q_hash);
  while( true ) {
    if (local_28.d ==
        (Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>_> *)0x0 &&
        local_28.bucket == 0) break;
    pSVar2 = (local_28.d)->spans;
    uVar3 = local_28.bucket >> 7;
    QList<QtGraphicsAnchorLayout::AnchorData_*>::append
              (__return_storage_ptr__,
               *(parameter_type *)
                pSVar2[uVar3].entries[pSVar2[uVar3].offsets[(uint)local_28.bucket & 0x7f]].storage.
                data);
    QHashPrivate::
    iterator<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>_>::operator++
              (&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

Q_OUTOFLINE_TEMPLATE QList<T> QSet<T>::values() const
{
    QList<T> result;
    result.reserve(size());
    typename QSet<T>::const_iterator i = constBegin();
    while (i != constEnd()) {
        result.append(*i);
        ++i;
    }
    return result;
}